

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

Entry * __thiscall
Lib::
DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Shell::Options::AbstractOptionValue_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  __type _Var1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint h2;
  Entry *res;
  uint pos;
  uint h1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  bool local_41;
  Entry *local_40;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_20;
  Entry *local_8;
  
  if (*(int *)&in_RDI->field_2 == 0) {
    local_8 = (Entry *)0x0;
  }
  else {
    local_20 = DefaultHash::hash((string *)0xc8acb6);
    local_20 = local_20 % *(uint *)&in_RDI->field_2;
    local_40 = (Entry *)(*(long *)((long)&in_RDI->field_2 + 8) + (ulong)local_20 * 0x30);
    if ((uint)(local_40->field_0)._infoData >> 2 == *(uint *)in_RDI) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
      if (_Var1) {
        if (((local_40->field_0)._infoData & 1U) != 0) {
          local_40 = (Entry *)0x0;
        }
        local_8 = local_40;
      }
      else if (((uint)(local_40->field_0)._infoData >> 1 & 1) == 0) {
        local_8 = (Entry *)0x0;
      }
      else {
        uVar2 = DefaultHash2::hash((string *)0xc8ad6f);
        uVar2 = uVar2 % *(uint *)&in_RDI->field_2;
        if (uVar2 == 0) {
          uVar2 = 1;
        }
        do {
          local_20 = (local_20 + uVar2) % *(uint *)&in_RDI->field_2;
          local_8 = (Entry *)(*(long *)((long)&in_RDI->field_2 + 8) + (ulong)local_20 * 0x30);
          local_41 = false;
          if ((uint)(local_8->field_0)._infoData >> 2 == *(uint *)in_RDI) {
            local_41 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          }
        } while (local_41 != false);
        if ((uint)(local_8->field_0)._infoData >> 2 == *(uint *)in_RDI) {
          if (((local_8->field_0)._infoData & 1U) != 0) {
            local_8 = (Entry *)0x0;
          }
        }
        else {
          local_8 = (Entry *)0x0;
        }
      }
    }
    else {
      local_8 = (Entry *)0x0;
    }
  }
  return local_8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }